

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turtlebot.cpp
# Opt level: O2

void __thiscall
chrono::turtlebot::Turtlebot_Part::Turtlebot_Part
          (Turtlebot_Part *this,string *name,bool fixed,shared_ptr<chrono::ChMaterialSurface> *mat,
          ChSystem *system,ChVector<double> *body_pos,ChQuaternion<double> *body_rot,
          shared_ptr<chrono::ChBodyAuxRef> *chassis_body,bool collide)

{
  undefined8 uVar1;
  element_type *peVar2;
  ChBodyAuxRef *__p;
  undefined1 auVar3 [64];
  undefined1 auVar4 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  auVar4._8_4_ = 0x3f800000;
  auVar4._0_8_ = 0x3f8000003f800000;
  auVar4._12_4_ = 0x3f800000;
  this->_vptr_Turtlebot_Part = (_func_int **)&PTR__Turtlebot_Part_001a13f8;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  (this->m_name)._M_string_length = 0;
  (this->m_name).field_2._M_local_buf[0] = '\0';
  (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_mat).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_mat).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_mesh_name)._M_dataplus._M_p = (pointer)&(this->m_mesh_name).field_2;
  (this->m_mesh_name)._M_string_length = 0;
  (this->m_mesh_name).field_2._M_local_buf[0] = '\0';
  (this->m_offset).m_data[2] = 0.0;
  *(undefined1 (*) [16])(this->m_offset).m_data = ZEXT416(0) << 0x40;
  auVar3 = ZEXT1264(ZEXT812(0));
  uVar1 = vmovlps_avx(auVar4);
  (this->m_color).R = (float)(int)uVar1;
  (this->m_color).G = (float)(int)((ulong)uVar1 >> 0x20);
  (this->m_color).B = 1.0;
  (this->m_rot).m_data[3] = 0.0;
  this->m_chassis = (shared_ptr<chrono::ChBodyAuxRef>)auVar3._0_16_;
  this->m_pos = (ChVector<double>)auVar3._16_24_;
  (this->m_rot).m_data[0] = (double)auVar3._40_8_;
  (this->m_rot).m_data[1] = (double)auVar3._48_8_;
  (this->m_rot).m_data[2] = (double)auVar3._56_8_;
  __p = (ChBodyAuxRef *)(**(code **)(*(long *)system + 0x188))(system);
  std::__shared_ptr<chrono::ChBodyAuxRef,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBodyAuxRef,void>
            ((__shared_ptr<chrono::ChBodyAuxRef,(__gnu_cxx::_Lock_policy)2> *)&local_50,__p);
  std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length);
  peVar2 = (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::operator+(&local_50,name,"_body");
  std::__cxx11::string::_M_assign((string *)(peVar2 + 8));
  std::__cxx11::string::~string((string *)&local_50);
  std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_chassis).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>
             ,&chassis_body->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_mat).
              super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>,
             &mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  if (&this->m_pos != body_pos) {
    (this->m_pos).m_data[0] = body_pos->m_data[0];
    (this->m_pos).m_data[1] = body_pos->m_data[1];
    (this->m_pos).m_data[2] = body_pos->m_data[2];
  }
  ChQuaternion<double>::operator=(&this->m_rot,body_rot);
  this->m_system = system;
  this->m_collide = collide;
  this->m_fixed = fixed;
  return;
}

Assistant:

Turtlebot_Part::Turtlebot_Part(const std::string& name,
                               bool fixed,
                               std::shared_ptr<ChMaterialSurface> mat,
                               ChSystem* system,
                               const ChVector<>& body_pos,
                               const ChQuaternion<>& body_rot,
                               std::shared_ptr<ChBodyAuxRef> chassis_body,
                               bool collide) {
    m_body = std::shared_ptr<ChBodyAuxRef>(system->NewBodyAuxRef());
    m_body->SetNameString(name + "_body");
    m_chassis = chassis_body;
    m_mat = mat;
    m_pos = body_pos;
    m_rot = body_rot;
    m_system = system;
    m_collide = collide;
    m_fixed = fixed;
}